

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

IncrementalStateType * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetIncrementalState(TraceContext *this)

{
  void *pvVar1;
  DataSourceInstanceThreadLocalState *pDVar2;
  
  pDVar2 = this->tls_inst_;
  if ((__atomic_base<unsigned_int>)pDVar2->incremental_state_generation !=
      static_state_.incremental_state_generation.super___atomic_base<unsigned_int>._M_i) {
    pvVar1 = (pDVar2->incremental_state)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
             _M_head_impl;
    (pDVar2->incremental_state)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = (void *)0x0;
    if (pvVar1 != (void *)0x0) {
      (*(_func_void_void_ptr *)
        (pDVar2->incremental_state)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
        super__Head_base<1UL,_void_(*)(void_*),_false>)();
    }
    CreateIncrementalStateImpl<perfetto::internal::TrackEventIncrementalState>
              (this->tls_inst_,(TrackEventIncrementalState *)0x0);
    pDVar2 = this->tls_inst_;
  }
  return (IncrementalStateType *)
         (pDVar2->incremental_state)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
         _M_head_impl;
}

Assistant:

typename DataSourceTraits::IncrementalStateType* GetIncrementalState() {
      // Recreate incremental state data if it has been reset by the service.
      if (tls_inst_->incremental_state_generation !=
          static_state_.incremental_state_generation.load(
              std::memory_order_relaxed)) {
        tls_inst_->incremental_state.reset();
        CreateIncrementalState(tls_inst_);
      }
      return reinterpret_cast<typename DataSourceTraits::IncrementalStateType*>(
          tls_inst_->incremental_state.get());
    }